

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

VRString * __thiscall MinVR::VRDatum::getPointerString_abi_cxx11_(VRDatum *this)

{
  VRError *this_00;
  long *plVar1;
  size_type *psVar2;
  int local_d4;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"This datum is not a VRString.","");
  std::operator+(&local_50,"It is a ",&this->description);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_4_ = (undefined4)plVar1[3];
    local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatum.h",
             "");
  local_d4 = 0x104;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"virtual const VRString *MinVR::VRDatum::getPointerString() const",
             "");
  VRError::VRError(this_00,&local_b0,&local_d0,&local_70,&local_d4,&local_90);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

virtual const VRString* getPointerString() const {
    VRERROR("This datum is not a VRString.", "It is a " + description + ".");
  }